

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

void Llb_Nonlin4RecordState
               (Aig_Man_t *pAig,Vec_Int_t *vOrder,uint *pState,char *pValues,int fBackward)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  
  iVar5 = pAig->nRegs;
  if (0 < iVar5) {
    pVVar2 = pAig->vCos;
    uVar3 = 0;
    do {
      uVar6 = pAig->nTruePos + uVar3;
      if (((((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) ||
          (uVar4 = pAig->nTruePis + uVar3, (int)uVar4 < 0)) || (pAig->vCis->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (fBackward == 0) {
        pvVar7 = pAig->vCis->pArray[uVar4];
      }
      else {
        pvVar7 = pVVar2->pArray[uVar6];
      }
      iVar1 = *(int *)((long)pvVar7 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pValues[vOrder->pArray[iVar1]] == '\x01') {
        pState[uVar3 >> 5] = pState[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
        iVar5 = pAig->nRegs;
      }
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < iVar5);
  }
  return;
}

Assistant:

void Llb_Nonlin4RecordState( Aig_Man_t * pAig, Vec_Int_t * vOrder, unsigned * pState, char * pValues, int fBackward )
{
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        if ( pValues[Llb_ObjBddVar(vOrder, fBackward? pObjLi : pObjLo)] == 1 )
            Abc_InfoSetBit( pState, i );
}